

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::randomizeConstraints(btSoftBody *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  Link *pLVar4;
  undefined8 *puVar5;
  Face *pFVar6;
  undefined8 *puVar7;
  Link *pLVar8;
  undefined8 *puVar9;
  Face *pFVar10;
  ulong uVar11;
  long lVar12;
  undefined8 local_70 [9];
  
  uVar1 = (this->m_links).m_size;
  lVar12 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  uVar11 = 0x3b7f7;
  for (; uVar2 * 0x48 - lVar12 != 0; lVar12 = lVar12 + 0x48) {
    pLVar8 = (this->m_links).m_data;
    puVar7 = (undefined8 *)((long)pLVar8->m_n + lVar12 + -0x10);
    uVar11 = (ulong)((int)uVar11 * 0x19660d + 0x3c6ef35f);
    pLVar8 = pLVar8 + (int)(uVar11 % (ulong)(long)(int)uVar1);
    puVar5 = puVar7;
    puVar9 = local_70;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar9 = *puVar5;
      puVar5 = puVar5 + 1;
      puVar9 = puVar9 + 1;
    }
    pLVar4 = pLVar8;
    for (lVar3 = 0x44; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined1 *)puVar7 = *(undefined1 *)&(pLVar4->super_Feature).super_Element.m_tag;
      pLVar4 = (Link *)((long)&(pLVar4->super_Feature).super_Element.m_tag + 1);
      puVar7 = (undefined8 *)((long)puVar7 + 1);
    }
    puVar7 = local_70;
    for (lVar3 = 0x44; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined1 *)&(pLVar8->super_Feature).super_Element.m_tag = *(undefined1 *)puVar7;
      puVar7 = (undefined8 *)((long)puVar7 + 1);
      pLVar8 = (Link *)((long)&(pLVar8->super_Feature).super_Element.m_tag + 1);
    }
  }
  uVar1 = (this->m_faces).m_size;
  lVar12 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar2 = (ulong)uVar1;
  }
  for (; uVar2 * 0x48 - lVar12 != 0; lVar12 = lVar12 + 0x48) {
    pFVar10 = (this->m_faces).m_data;
    puVar7 = (undefined8 *)((long)pFVar10->m_n + lVar12 + -0x10);
    uVar11 = (ulong)((int)uVar11 * 0x19660d + 0x3c6ef35f);
    pFVar10 = pFVar10 + (int)(uVar11 % (ulong)(long)(int)uVar1);
    puVar5 = puVar7;
    puVar9 = local_70;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar9 = *puVar5;
      puVar5 = puVar5 + 1;
      puVar9 = puVar9 + 1;
    }
    pFVar6 = pFVar10;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = (pFVar6->super_Feature).super_Element.m_tag;
      pFVar6 = (Face *)&(pFVar6->super_Feature).m_material;
      puVar7 = puVar7 + 1;
    }
    puVar7 = local_70;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pFVar10->super_Feature).super_Element.m_tag = (void *)*puVar7;
      puVar7 = puVar7 + 1;
      pFVar10 = (Face *)&(pFVar10->super_Feature).m_material;
    }
  }
  return;
}

Assistant:

void			btSoftBody::randomizeConstraints()
{
	unsigned long	seed=243703;
#define NEXTRAND (seed=(1664525L*seed+1013904223L)&0xffffffff)
	int i,ni;

	for(i=0,ni=m_links.size();i<ni;++i)
	{
		btSwap(m_links[i],m_links[NEXTRAND%ni]);
	}
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		btSwap(m_faces[i],m_faces[NEXTRAND%ni]);
	}
#undef NEXTRAND
}